

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_SetColor(FParser *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FDynamicColormap *pFVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  FSSectorTagIterator itr;
  FSectorTagIterator local_30;
  
  if (this->t_argc < 2) {
    script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
    return;
  }
  uVar1 = intvalue(this->t_argv);
  local_30.searchtag = uVar1;
  if (uVar1 == 0) {
    local_30.start = 0;
  }
  else {
    local_30.start = tagManager.TagHashFirst[uVar1 & 0xff];
    if ((int)uVar1 < 0) {
      local_30.searchtag = 0x80000000;
      iVar2 = -uVar1;
      iVar3 = -1;
      if (numsectors != iVar2 && SBORROW4(numsectors,iVar2) == (int)(numsectors + uVar1) < 0) {
        iVar3 = iVar2;
      }
      local_30.start = 0;
      if (uVar1 != 0xffff8000) {
        local_30.start = iVar3;
      }
    }
  }
  iVar3 = FSectorTagIterator::Next(&local_30);
  if (-1 < iVar3) {
    if ((this->t_argc & 0xfffffffeU) == 2) {
      uVar4 = intvalue(this->t_argv + 1);
      uVar8 = uVar4 >> 8;
      uVar7 = uVar4 >> 0x10;
      uVar6 = uVar4 & 0xff000000;
    }
    else {
      if (this->t_argc < 4) {
        return;
      }
      uVar7 = intvalue(this->t_argv + 1);
      uVar8 = intvalue(this->t_argv + 2);
      uVar4 = intvalue(this->t_argv + 3);
      uVar6 = 0;
    }
    if (uVar1 == 0) {
      local_30.start = 0;
      local_30.searchtag = uVar1;
    }
    else {
      local_30.searchtag = uVar1;
      local_30.start = tagManager.TagHashFirst[uVar1 & 0xff];
      if ((int)uVar1 < 0) {
        local_30.searchtag = 0x80000000;
        iVar2 = -uVar1;
        iVar3 = -1;
        if (numsectors != iVar2 && SBORROW4(numsectors,iVar2) == (int)(numsectors + uVar1) < 0) {
          iVar3 = iVar2;
        }
        local_30.start = 0;
        if (uVar1 != 0xffff8000) {
          local_30.start = iVar3;
        }
      }
    }
    uVar1 = FSectorTagIterator::Next(&local_30);
    if (-1 < (int)uVar1) {
      do {
        pFVar5 = GetSpecialLights((PalEntry)
                                  (uVar4 & 0xff | (uVar8 & 0xff) << 8 |
                                  (uVar7 & 0xff) << 0x10 | uVar6),
                                  (PalEntry)((sectors[uVar1].ColorMap)->Fade).field_0.field_0,0);
        sectors[uVar1].ColorMap = pFVar5;
        uVar1 = FSectorTagIterator::Next(&local_30);
      } while (-1 < (int)uVar1);
    }
  }
  return;
}

Assistant:

void FParser::SF_SetColor(void)
{
	int tagnum, secnum;
	int c=2;
	int i = -1;
	PalEntry color=0;
	
	if (CheckArgs(2))
	{
		tagnum = intvalue(t_argv[0]);
		
		secnum = T_FindFirstSectorFromTag(tagnum);
		
		if(secnum < 0)
		{ 
			return;
		}
		
		if(t_argc >1 && t_argc<4)
		{
			color=intvalue(t_argv[1]);
		}
		else if (t_argc>=4)
		{
			color.r=intvalue(t_argv[1]);
			color.g=intvalue(t_argv[2]);
			color.b=intvalue(t_argv[3]);
			color.a=0;
		}
		else return;

		// set all sectors with tag
		FSSectorTagIterator itr(tagnum);
		while ((i = itr.Next()) >= 0)
		{
			sectors[i].ColorMap = GetSpecialLights (color, sectors[i].ColorMap->Fade, 0);
		}
	}
}